

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O2

REF_STATUS
ref_cell_id_list_around(REF_CELL ref_cell,REF_INT node,REF_INT max_ids,REF_INT *n_ids,REF_INT *ids)

{
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  REF_INT cell;
  uint uVar8;
  REF_INT nodes [27];
  
  *n_ids = 0;
  uVar7 = 0xffffffff;
  cell = -1;
  if (-1 < node) {
    pRVar1 = ref_cell->ref_adj;
    uVar7 = 0xffffffff;
    cell = -1;
    if (node < pRVar1->nnode) {
      uVar8 = pRVar1->first[(uint)node];
      uVar7 = 0xffffffff;
      cell = -1;
      if ((long)(int)uVar8 != -1) {
        cell = pRVar1->item[(int)uVar8].ref;
        uVar7 = (ulong)uVar8;
      }
    }
  }
  uVar8 = 0;
  while( true ) {
    if ((int)uVar7 == -1) {
      return 0;
    }
    uVar4 = ref_cell_nodes(ref_cell,cell,nodes);
    if (uVar4 != 0) break;
    uVar5 = 0;
    uVar6 = 0;
    if (0 < (int)uVar8) {
      uVar6 = (ulong)uVar8;
    }
    bVar3 = false;
    for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      if (nodes[ref_cell->node_per] == ids[uVar5]) {
        bVar3 = true;
      }
    }
    if (!bVar3) {
      if (max_ids <= (int)uVar8) {
        return 7;
      }
      ids[(int)uVar8] = nodes[ref_cell->node_per];
      uVar8 = *n_ids + 1;
      *n_ids = uVar8;
    }
    pRVar2 = ref_cell->ref_adj->item;
    uVar7 = (ulong)pRVar2[(int)uVar7].next;
    cell = -1;
    if (uVar7 != 0xffffffffffffffff) {
      cell = pRVar2[uVar7].ref;
    }
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x4fc,
         "ref_cell_id_list_around",(ulong)uVar4,"nodes");
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_cell_id_list_around(REF_CELL ref_cell, REF_INT node,
                                           REF_INT max_ids, REF_INT *n_ids,
                                           REF_INT *ids) {
  REF_INT item, cell, id, deg;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL already_have_it;

  *n_ids = 0;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    id = nodes[ref_cell_node_per(ref_cell)];
    already_have_it = REF_FALSE;
    for (deg = 0; deg < *n_ids; deg++)
      if (id == ids[deg]) already_have_it = REF_TRUE;
    if (!already_have_it) {
      if (*n_ids >= max_ids) {
        return REF_INCREASE_LIMIT;
      }
      ids[*n_ids] = id;
      (*n_ids)++;
    }
  }

  return REF_SUCCESS;
}